

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

void Ssw_ManDumpEquivMiter(Aig_Man_t *p,Vec_Int_t *vPairs,int Num,int fAddOuts)

{
  int iVar1;
  Aig_Man_t *pMan;
  Aig_Man_t *pNew;
  char pBuffer [16];
  FILE *pFile;
  int fAddOuts_local;
  int Num_local;
  Vec_Int_t *vPairs_local;
  Aig_Man_t *p_local;
  
  sprintf((char *)&pNew,"equiv%03d.aig",(ulong)(uint)Num);
  pBuffer._8_8_ = fopen((char *)&pNew,"w");
  if ((FILE *)pBuffer._8_8_ == (FILE *)0x0) {
    Abc_Print(1,"Cannot open file %s for writing.\n",&pNew);
  }
  else {
    fclose((FILE *)pBuffer._8_8_);
    pMan = Saig_ManCreateEquivMiter(p,vPairs,fAddOuts);
    Ioa_WriteAiger(pMan,(char *)&pNew,0,0);
    Aig_ManStop(pMan);
    iVar1 = Vec_IntSize(vPairs);
    Abc_Print(1,"AIG with %4d disproved equivs is dumped into file \"%s\".\n",
              (long)iVar1 / 2 & 0xffffffff,&pNew);
  }
  return;
}

Assistant:

void Ssw_ManDumpEquivMiter( Aig_Man_t * p, Vec_Int_t * vPairs, int Num, int fAddOuts )
{
    FILE * pFile;
    char pBuffer[16];
    Aig_Man_t * pNew;
    sprintf( pBuffer, "equiv%03d.aig", Num );
    pFile = fopen( pBuffer, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file %s for writing.\n", pBuffer );
        return;
    }
    fclose( pFile );
    pNew = Saig_ManCreateEquivMiter( p, vPairs, fAddOuts );
    Ioa_WriteAiger( pNew, pBuffer, 0, 0 );
    Aig_ManStop( pNew );
    Abc_Print( 1, "AIG with %4d disproved equivs is dumped into file \"%s\".\n", Vec_IntSize(vPairs)/2, pBuffer );
}